

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_buffer_method_get(jit_State *J,RecordFFData *rd)

{
  long lVar1;
  TRef TVar2;
  TRef TVar3;
  uint uVar4;
  TRef TVar5;
  TRef *pTVar6;
  IRRef1 IVar7;
  IRRef1 IVar8;
  long lVar9;
  
  TVar2 = recff_sbufx_check(J,(RecordFFData *)&rd->argv->gcr,0);
  IVar7 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op1 = IVar7;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090013;
  TVar2 = lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = IVar7;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4509000e;
  TVar3 = lj_opt_fold(J);
  pTVar6 = J->base;
  uVar4 = pTVar6[1];
  if (uVar4 == 0) {
    pTVar6[1] = 0x7fff;
    pTVar6[2] = 0;
    uVar4 = 0;
  }
  lVar9 = 1;
  do {
    if ((uVar4 & 0x1f000000) != 0) {
      TVar5 = recff_sbufx_checkint(J,rd,lVar9);
      pTVar6 = J->base;
      pTVar6[lVar9] = TVar5;
    }
    uVar4 = pTVar6[lVar9 + 1];
    lVar9 = lVar9 + 1;
  } while (uVar4 != 0);
  lVar9 = 0;
  uVar4 = pTVar6[1];
  while (uVar4 != 0) {
    (J->fold).ins.field_0.ot = 0x2a15;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    IVar8 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = IVar8;
    TVar2 = lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b131275;
    TVar2 = lj_opt_fold(J);
    if ((uVar4 & 0x1f000000) == 0) {
      (J->fold).ins.field_0.ot = 0x5004;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      TVar2 = lj_opt_fold(J);
      J->base[lVar9] = TVar2;
      TVar2 = TVar3;
      IVar8 = (IRRef1)TVar3;
    }
    else {
      (J->fold).ins.field_0.ot = 0x3213;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar4;
      TVar5 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      TVar2 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x5004;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      TVar5 = lj_opt_fold(J);
      J->base[lVar9] = TVar5;
      IVar8 = (IRRef1)TVar2;
    }
    (J->fold).ins.field_0.op1 = IVar7;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e090013;
    TVar5 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x4d09;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = IVar8;
    lj_opt_fold(J);
    lVar1 = lVar9 + 2;
    lVar9 = lVar9 + 1;
    uVar4 = J->base[lVar1];
  }
  rd->nres = lVar9;
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_get(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trr = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_R);
  TRef trw = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_W);
  TRef tr;
  ptrdiff_t arg;
  if (!J->base[1]) { J->base[1] = TREF_NIL; J->base[2] = 0; }
  for (arg = 0; (tr = J->base[arg+1]); arg++) {
    if (!tref_isnil(tr)) {
      J->base[arg+1] = recff_sbufx_checkint(J, rd, arg+1);
    }
  }
  for (arg = 0; (tr = J->base[arg+1]); arg++) {
    TRef len = recff_sbufx_len(J, trr, trw);
    if (tref_isnil(tr)) {
      J->base[arg] = emitir(IRT(IR_XSNEW, IRT_STR), trr, len);
      trr = trw;
    } else {
      TRef tru;
      len = emitir(IRTI(IR_MIN), len, tr);
      tru = emitir(IRT(IR_ADD, IRT_PTR), trr, len);
      J->base[arg] = emitir(IRT(IR_XSNEW, IRT_STR), trr, len);
      trr = tru;  /* Doing the ADD before the SNEW generates better code. */
    }
    recff_sbufx_set_ptr(J, ud, IRFL_SBUF_R, trr);
  }
  rd->nres = arg;
}